

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall GT7VolumeFile::parseExtendedHeader(GT7VolumeFile *this,StreamDesc *streamDesc)

{
  bool bVar1;
  long *plVar2;
  long in_RSI;
  uint64_t unaff_retaddr;
  ExtHeader *header;
  VolumeFile *in_stack_00000020;
  bool local_1;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x134c88);
  bVar1 = VolumeFile::readDataAt
                    (in_stack_00000020,(ifstream *)this,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)streamDesc,
                     (uint64_t)header,unaff_retaddr);
  if (bVar1) {
    plVar2 = (long *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x134ccb);
    if (*plVar2 == 0x2b26958523ad) {
      if (((int)plVar2[1] == 0) || ((*(uint *)(plVar2 + 1) & 0x3ff) != 0)) {
        local_1 = false;
      }
      else if ((*(int *)((long)plVar2 + 0xc) == 0) || ((*(uint *)((long)plVar2 + 0xc) & 0x3ff) != 0)
              ) {
        local_1 = false;
      }
      else {
        *(int *)(in_RSI + 0x248) = (int)plVar2[1];
        *(undefined4 *)(in_RSI + 0x24c) = *(undefined4 *)((long)plVar2 + 0xc);
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GT7VolumeFile::parseExtendedHeader(StreamDesc& streamDesc)
{
	streamDesc.extHeader.clear();

	if (!readDataAt(streamDesc.stream, streamDesc.extHeader, 0, sizeof(ExtHeader))) {
		return false;
	}

	const auto& header = *reinterpret_cast<ExtHeader*>(streamDesc.extHeader.data());
	if (header.magic != EXT_HEADER_MAGIC) {
		return false;
	}
	if (header.sectorSize == 0 || (header.sectorSize % EXT_ALIGNMENT != 0)) {
		return false;
	}
	if (header.segmentSize == 0 || (header.segmentSize % EXT_ALIGNMENT != 0)) {
		return false;
	}
	
	streamDesc.sectorSize = header.sectorSize;
	streamDesc.segmentSize = header.segmentSize;
	
	return true;
}